

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

string * __thiscall
cmScriptGenerator::CreateConfigTest
          (string *__return_storage_ptr__,cmScriptGenerator *this,string *config)

{
  ulong uVar1;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmScriptGenerator *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmScriptGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_58,&this->RuntimeConfigVariable);
  cmAlphaNum::cmAlphaNum(&local_88," MATCHES \"^(");
  cmStrCat<>(__return_storage_ptr__,&local_58,&local_88);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmScriptGeneratorEncodeConfig(local_20,__return_storage_ptr__);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")$\"");
  return __return_storage_ptr__;
}

Assistant:

std::string cmScriptGenerator::CreateConfigTest(const std::string& config)
{
  std::string result = cmStrCat(this->RuntimeConfigVariable, " MATCHES \"^(");
  if (!config.empty()) {
    cmScriptGeneratorEncodeConfig(config, result);
  }
  result += ")$\"";
  return result;
}